

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

string * google::Munge(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  ostream *poVar2;
  int err;
  int err_00;
  int err_01;
  int err_02;
  int err_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14d0;
  string local_14b0;
  allocator<char> local_1489;
  string local_1488;
  string local_1468;
  allocator<char> local_1441;
  string local_1440;
  string local_1420;
  allocator<char> local_13f9;
  string local_13f8;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  string local_1390;
  allocator<char> local_1369;
  string local_1368;
  allocator<char> local_1341;
  string local_1340;
  allocator<char> local_1319;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  allocator<char> local_12c9;
  string local_12c8;
  char local_12a8 [8];
  char ptr_str [256];
  char null_str [256];
  string local_10a0;
  undefined1 local_1080 [8];
  string line;
  char local_1058 [8];
  char buf [4096];
  LogMessage local_38;
  LogMessageVoidify local_21;
  FILE *local_20;
  FILE *fp;
  string *filename_local;
  string *result;
  
  fp = (FILE *)filename;
  filename_local = __return_storage_ptr__;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(pcVar1,"rb");
  if (local_20 != (FILE *)0x0) {
    line.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while (pcVar1 = fgets(local_1058,0xfff,local_20), pcVar1 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10a0,local_1058,(allocator<char> *)(null_str + 0xff));
      MungeLine((string *)local_1080,&local_10a0);
      std::__cxx11::string::~string((string *)&local_10a0);
      std::allocator<char>::~allocator((allocator<char> *)(null_str + 0xff));
      sprintf(ptr_str + 0xf8,"%p",0);
      sprintf(local_12a8,"%p",0x12345678);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12c8,"__NULLP__",&local_12c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12f0,ptr_str + 0xf8,&local_12f1);
      StringReplace((string *)local_1080,&local_12c8,&local_12f0);
      std::__cxx11::string::~string((string *)&local_12f0);
      std::allocator<char>::~allocator(&local_12f1);
      std::__cxx11::string::~string((string *)&local_12c8);
      std::allocator<char>::~allocator(&local_12c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1318,"__PTRTEST__",&local_1319);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1340,local_12a8,&local_1341);
      StringReplace((string *)local_1080,&local_1318,&local_1340);
      std::__cxx11::string::~string((string *)&local_1340);
      std::allocator<char>::~allocator(&local_1341);
      std::__cxx11::string::~string((string *)&local_1318);
      std::allocator<char>::~allocator(&local_1319);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1368,"__SUCCESS__",&local_1369);
      StrError_abi_cxx11_(&local_1390,(google *)0x0,err);
      StringReplace((string *)local_1080,&local_1368,&local_1390);
      std::__cxx11::string::~string((string *)&local_1390);
      std::__cxx11::string::~string((string *)&local_1368);
      std::allocator<char>::~allocator(&local_1369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13b0,"__ENOENT__",&local_13b1);
      StrError_abi_cxx11_(&local_13d8,(google *)0x2,err_00);
      StringReplace((string *)local_1080,&local_13b0,&local_13d8);
      std::__cxx11::string::~string((string *)&local_13d8);
      std::__cxx11::string::~string((string *)&local_13b0);
      std::allocator<char>::~allocator(&local_13b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13f8,"__EINTR__",&local_13f9);
      StrError_abi_cxx11_(&local_1420,(google *)0x4,err_01);
      StringReplace((string *)local_1080,&local_13f8,&local_1420);
      std::__cxx11::string::~string((string *)&local_1420);
      std::__cxx11::string::~string((string *)&local_13f8);
      std::allocator<char>::~allocator(&local_13f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1440,"__ENXIO__",&local_1441);
      StrError_abi_cxx11_(&local_1468,(google *)0x6,err_02);
      StringReplace((string *)local_1080,&local_1440,&local_1468);
      std::__cxx11::string::~string((string *)&local_1468);
      std::__cxx11::string::~string((string *)&local_1440);
      std::allocator<char>::~allocator(&local_1441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1488,"__ENOEXEC__",&local_1489);
      StrError_abi_cxx11_(&local_14b0,(google *)0x8,err_03);
      StringReplace((string *)local_1080,&local_1488,&local_14b0);
      std::__cxx11::string::~string((string *)&local_14b0);
      std::__cxx11::string::~string((string *)&local_1488);
      std::allocator<char>::~allocator(&local_1489);
      std::operator+(&local_14d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1080
                     ,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_14d0);
      std::__cxx11::string::~string((string *)&local_14d0);
      std::__cxx11::string::~string((string *)local_1080);
    }
    fclose(local_20);
    return __return_storage_ptr__;
  }
  LogMessageVoidify::LogMessageVoidify(&local_21);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x1be);
  poVar2 = LogMessage::stream(&local_38);
  poVar2 = std::operator<<(poVar2,"Check failed: fp != NULL ");
  poVar2 = std::operator<<(poVar2,(string *)fp);
  poVar2 = std::operator<<(poVar2,": couldn\'t open");
  LogMessageVoidify::operator&(&local_21,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

static inline string Munge(const string& filename) {
  FILE* fp = fopen(filename.c_str(), "rb");
  CHECK(fp != NULL) << filename << ": couldn't open";
  char buf[4096];
  string result;
  while (fgets(buf, 4095, fp)) {
    string line = MungeLine(buf);
    char null_str[256];
    char ptr_str[256];
    sprintf(null_str, "%p", static_cast<void*>(NULL));
    sprintf(ptr_str, "%p", reinterpret_cast<void*>(PTR_TEST_VALUE));

    StringReplace(&line, "__NULLP__", null_str);
    StringReplace(&line, "__PTRTEST__", ptr_str);

    StringReplace(&line, "__SUCCESS__", StrError(0));
    StringReplace(&line, "__ENOENT__", StrError(ENOENT));
    StringReplace(&line, "__EINTR__", StrError(EINTR));
    StringReplace(&line, "__ENXIO__", StrError(ENXIO));
    StringReplace(&line, "__ENOEXEC__", StrError(ENOEXEC));
    result += line + "\n";
  }
  fclose(fp);
  return result;
}